

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O2

CSampleHandle __thiscall CSound::LoadWV(CSound *this,char *pFilename)

{
  long lVar1;
  int iVar2;
  uint SampleID;
  uint32_t samples;
  uint uVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  WavpackContext *wpc;
  int32_t *buffer;
  short *psVar5;
  ulong uVar6;
  CSound *this_00;
  ulong uVar7;
  long in_FS_OFFSET;
  char aError [100];
  IOHANDLE io;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SampleID = 0xffffffff;
  if (((this->m_pConfig->m_DbgStress != 0) || (this->m_SoundEnabled == 0)) ||
     (this->m_pStorage == (IStorage *)0x0)) goto LAB_00126989;
  lock_wait(m_SoundLock);
  this_00 = (CSound *)this->m_pStorage;
  iVar2 = (*((IInterface *)&this_00->super_IEngineSound)->_vptr_IInterface[4])
                    (this_00,pFilename,1,0xffffffff,0,0,0,0);
  io = (IOHANDLE)CONCAT44(extraout_var,iVar2);
  s_File = io;
  if (io == (IOHANDLE)0x0) {
    dbg_msg("sound/wv","failed to open file. filename=\'%s\'",pFilename);
  }
  else {
    SampleID = AllocID(this_00);
    if (-1 < (int)SampleID) {
      wpc = WavpackOpenFileInput(ReadDataOld,aError);
      if (wpc == (WavpackContext *)0x0) {
        dbg_msg("sound/wv","failed to open %s: %s",pFilename,aError);
LAB_0012693d:
        io_close(s_File);
        s_File = (IOHANDLE)0x0;
        if (this->m_pConfig->m_Debug != 0) {
          dbg_msg("sound/wv","loaded %s",pFilename);
        }
        RateConvert(SampleID);
        lock_unlock(m_SoundLock);
      }
      else {
        samples = WavpackGetNumSamples(wpc);
        uVar3 = WavpackGetBitsPerSample(wpc);
        uVar4 = WavpackGetSampleRate(wpc);
        iVar2 = WavpackGetNumChannels(wpc);
        m_aSamples[SampleID].m_Channels = iVar2;
        m_aSamples[SampleID].m_Rate = uVar4;
        if (iVar2 < 3) {
          if (uVar3 == 0x10) {
            uVar3 = iVar2 * samples;
            buffer = (int32_t *)mem_alloc(uVar3 * 4);
            WavpackUnpackSamples(wpc,buffer,samples);
            psVar5 = (short *)mem_alloc(uVar3 * 2);
            m_aSamples[SampleID].m_pData = psVar5;
            uVar6 = 0;
            uVar7 = (ulong)uVar3;
            if ((int)uVar3 < 1) {
              uVar7 = uVar6;
            }
            for (; (int)uVar7 != (int)uVar6; uVar6 = uVar6 + 1) {
              psVar5[uVar6] = (short)buffer[uVar6];
            }
            mem_free(buffer);
            m_aSamples[SampleID].m_NumFrames = samples;
            m_aSamples[SampleID].m_LoopStart = -1;
            m_aSamples[SampleID].m_LoopEnd = -1;
            m_aSamples[SampleID].m_PausedAt = 0;
            goto LAB_0012693d;
          }
          dbg_msg("sound/wv","bps is %d, not 16, filname=\'%s\'",(ulong)uVar3,pFilename);
        }
        else {
          dbg_msg("sound/wv","file is not mono or stereo. filename=\'%s\'",pFilename);
        }
        io_close(s_File);
        s_File = (IOHANDLE)0x0;
        lock_unlock(m_SoundLock);
        SampleID = 0xffffffff;
      }
      goto LAB_00126989;
    }
    io_close(io);
    s_File = (IOHANDLE)0x0;
  }
  lock_unlock(m_SoundLock);
  SampleID = 0xffffffff;
LAB_00126989:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (CSampleHandle)SampleID;
  }
  __stack_chk_fail();
}

Assistant:

ISound::CSampleHandle CSound::LoadWV(const char *pFilename)
{
	CSample *pSample;
	int SampleID = -1;
	char aError[100];
	WavpackContext *pContext;

	// don't waste memory on sound when we are stress testing
	if(m_pConfig->m_DbgStress)
		return CSampleHandle();

	// no need to load sound when we are running with no sound
	if(!m_SoundEnabled)
		return CSampleHandle();

	if(!m_pStorage)
		return CSampleHandle();

	lock_wait(m_SoundLock);
	s_File = m_pStorage->OpenFile(pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!s_File)
	{
		dbg_msg("sound/wv", "failed to open file. filename='%s'", pFilename);
		lock_unlock(m_SoundLock);
		return CSampleHandle();
	}

	SampleID = AllocID();
	if(SampleID < 0)
	{
		io_close(s_File);
		s_File = 0;
		lock_unlock(m_SoundLock);
		return CSampleHandle();
	}
	pSample = &m_aSamples[SampleID];

#if defined(CONF_WAVPACK_OPEN_FILE_INPUT_EX)
	WavpackStreamReader Callback = {0};
	Callback.can_seek = ReturnFalse;
	Callback.get_length = GetLength;
	Callback.get_pos = GetPos;
	Callback.push_back_byte = PushBackByte;
	Callback.read_bytes = ReadData;
	pContext = WavpackOpenFileInputEx(&Callback, (void *)1, 0, aError, 0, 0);
#else
	pContext = WavpackOpenFileInput(ReadDataOld, aError);
#endif
	if (pContext)
	{
		int m_aSamples = WavpackGetNumSamples(pContext);
		int BitsPerSample = WavpackGetBitsPerSample(pContext);
		unsigned int SampleRate = WavpackGetSampleRate(pContext);
		int m_aChannels = WavpackGetNumChannels(pContext);
		int *pData;
		int *pSrc;
		short *pDst;
		int i;

		pSample->m_Channels = m_aChannels;
		pSample->m_Rate = SampleRate;

		if(pSample->m_Channels > 2)
		{
			dbg_msg("sound/wv", "file is not mono or stereo. filename='%s'", pFilename);
			io_close(s_File);
			s_File = 0;
			lock_unlock(m_SoundLock);
			return CSampleHandle();
		}

		/*
		if(snd->rate != 44100)
		{
			dbg_msg("sound/wv", "file is %d Hz, not 44100 Hz. filename='%s'", snd->rate, filename);
			return -1;
		}*/

		if(BitsPerSample != 16)
		{
			dbg_msg("sound/wv", "bps is %d, not 16, filname='%s'", BitsPerSample, pFilename);
			io_close(s_File);
			s_File = 0;
			lock_unlock(m_SoundLock);
			return CSampleHandle();
		}

		pData = (int *)mem_alloc(4*m_aSamples*m_aChannels);
		WavpackUnpackSamples(pContext, pData, m_aSamples); // TODO: check return value
		pSrc = pData;

		pSample->m_pData = (short *)mem_alloc(2*m_aSamples*m_aChannels);
		pDst = pSample->m_pData;

		for (i = 0; i < m_aSamples*m_aChannels; i++)
			*pDst++ = (short)*pSrc++;

		mem_free(pData);

		pSample->m_NumFrames = m_aSamples;
		pSample->m_LoopStart = -1;
		pSample->m_LoopEnd = -1;
		pSample->m_PausedAt = 0;
	}
	else
	{
		dbg_msg("sound/wv", "failed to open %s: %s", pFilename, aError);
	}

	io_close(s_File);
	s_File = NULL;

	if(m_pConfig->m_Debug)
		dbg_msg("sound/wv", "loaded %s", pFilename);

	RateConvert(SampleID);
	lock_unlock(m_SoundLock);
	return CreateSampleHandle(SampleID);
}